

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTDMT_computeOverlapSize(ZSTD_CCtx_params *params)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = params->overlapLog;
  if (9 < uVar4) {
    __assert_fail("0 <= ovlog && ovlog <= 9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4f14,"int ZSTDMT_overlapLog(int, ZSTD_strategy)");
  }
  if (uVar4 == 0) {
    uVar4 = (params->cParams).strategy - ZSTD_lazy2;
    iVar2 = 3;
    if (uVar4 < 5) {
      iVar2 = *(int *)(&DAT_001a8014 + (ulong)uVar4 * 4);
    }
  }
  else {
    if (uVar4 == 1) {
      uVar4 = 0;
      iVar2 = 8;
      goto LAB_0015c658;
    }
    iVar2 = 9 - uVar4;
  }
  uVar4 = (params->cParams).windowLog - iVar2;
LAB_0015c658:
  if ((params->ldmParams).enableLdm != 0) {
    uVar1 = (params->cParams).windowLog;
    uVar5 = (params->cParams).chainLog + 4;
    uVar4 = 0x1e;
    if (uVar5 < 0x1e) {
      uVar4 = uVar5;
    }
    uVar5 = 0x15;
    if (0x15 < uVar4) {
      uVar5 = uVar4;
    }
    uVar4 = uVar5 - 2;
    if (uVar1 < uVar5 - 2) {
      uVar4 = uVar1;
    }
    uVar4 = uVar4 - iVar2;
  }
  if (uVar4 < 0x20) {
    sVar3 = 0;
    if (uVar4 != 0) {
      sVar3 = 1L << ((byte)uVar4 & 0x3f);
    }
    return sVar3;
  }
  __assert_fail("0 <= ovLog && ovLog <= ZSTD_WINDOWLOG_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x4f26,"size_t ZSTDMT_computeOverlapSize(const ZSTD_CCtx_params *)");
}

Assistant:

static size_t ZSTDMT_computeOverlapSize(const ZSTD_CCtx_params* params)
{
    int const overlapRLog = 9 - ZSTDMT_overlapLog(params->overlapLog, params->cParams.strategy);
    int ovLog = (overlapRLog >= 8) ? 0 : (params->cParams.windowLog - overlapRLog);
    assert(0 <= overlapRLog && overlapRLog <= 8);
    if (params->ldmParams.enableLdm) {
        /* In Long Range Mode, the windowLog is typically oversized.
         * In which case, it's preferable to determine the jobSize
         * based on chainLog instead.
         * Then, ovLog becomes a fraction of the jobSize, rather than windowSize */
        ovLog = MIN(params->cParams.windowLog, ZSTDMT_computeTargetJobLog(params) - 2)
                - overlapRLog;
    }
    assert(0 <= ovLog && ovLog <= ZSTD_WINDOWLOG_MAX);
    DEBUGLOG(4, "overlapLog : %i", params->overlapLog);
    DEBUGLOG(4, "overlap size : %i", 1 << ovLog);
    return (ovLog==0) ? 0 : (size_t)1 << ovLog;
}